

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void Catch::defaultListTests
               (ostream *out,ColourImpl *streamColour,
               vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests,
               bool isFiltered,Verbosity verbosity)

{
  pointer pTVar1;
  TestCaseInfo *pTVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  char cVar5;
  uint uVar6;
  ostream *poVar7;
  undefined7 in_register_00000009;
  long lVar8;
  size_type sVar9;
  char *pcVar10;
  Column *pCVar11;
  const_iterator __end2;
  pointer pTVar12;
  const_iterator __begin2;
  char local_b1;
  Column local_b0;
  Verbosity local_74;
  enable_if_t<_::Catch::Detail::IsStreamInsertable<SourceLineInfo>::value,_std::string> local_70;
  undefined4 local_4c;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *local_48;
  pointer local_40;
  ColourImpl *local_38;
  
  local_74 = verbosity;
  local_38 = streamColour;
  if (verbosity == Quiet) {
    pTVar12 = (tests->
              super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pTVar1 = (tests->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar12 != pTVar1) {
      do {
        pTVar2 = pTVar12->m_info;
        pCVar11 = (Column *)(pTVar2->name)._M_dataplus._M_p;
        sVar9 = (pTVar2->name)._M_string_length;
        poVar7 = out;
        if ((sVar9 != 0) && (*(char *)&(pCVar11->m_string)._M_dataplus._M_p == '#')) {
          local_b0.m_string._M_dataplus._M_p._0_1_ = 0x22;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_b0,1);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(pTVar2->name)._M_dataplus._M_p,(pTVar2->name)._M_string_length
                             );
          local_b0.m_string._M_dataplus._M_p._0_1_ = 0x22;
          sVar9 = 1;
          pCVar11 = &local_b0;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)pCVar11,sVar9);
        local_b0.m_string._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_b0,1);
        pTVar12 = pTVar12 + 1;
      } while (pTVar12 != pTVar1);
    }
  }
  else {
    local_4c = (undefined4)CONCAT71(in_register_00000009,isFiltered);
    if (isFiltered) {
      pcVar10 = "Matching test cases:\n";
      lVar8 = 0x15;
    }
    else {
      pcVar10 = "All available test cases:\n";
      lVar8 = 0x1a;
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,pcVar10,lVar8);
    pTVar12 = (tests->
              super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
              _M_impl.super__Vector_impl_data._M_start;
    local_40 = (tests->
               super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    local_48 = tests;
    if (pTVar12 != local_40) {
      do {
        pTVar2 = pTVar12->m_info;
        uVar6 = 0x17;
        if ((pTVar2->properties & IsHidden) == None) {
          uVar6 = 0;
        }
        local_b0.m_string._M_dataplus._M_p = (pointer)local_38;
        local_b0.m_string._M_string_length._0_5_ = (uint5)uVar6;
        ColourImpl::ColourGuard::engageImpl((ColourGuard *)&local_b0,out);
        _Var4._M_p = local_b0.m_string._M_dataplus._M_p;
        cVar5 = local_b0.m_string._M_string_length._4_1_;
        local_b0.m_string._M_dataplus._M_p = (pointer)&local_b0.m_string.field_2;
        pcVar3 = (pTVar2->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar3,pcVar3 + (pTVar2->name)._M_string_length);
        local_b0.m_width = 0x4f;
        local_b0.m_initialIndent = 0xffffffffffffffff;
        local_b0.m_indent = 2;
        TextFlow::operator<<(out,&local_b0);
        local_70._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_70,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.m_string._M_dataplus._M_p != &local_b0.m_string.field_2) {
          operator_delete(local_b0.m_string._M_dataplus._M_p,
                          local_b0.m_string.field_2._M_allocated_capacity + 1);
        }
        if (1 < (int)local_74) {
          StringMaker<Catch::SourceLineInfo,_void>::convert<Catch::SourceLineInfo>
                    (&local_70,&pTVar2->lineInfo);
          local_b0.m_string._M_dataplus._M_p = (pointer)&local_b0.m_string.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,
                     CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_),
                     local_70._M_string_length +
                     CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_));
          local_b0.m_width = 0x4f;
          local_b0.m_initialIndent = 0xffffffffffffffff;
          local_b0.m_indent = 4;
          TextFlow::operator<<(out,&local_b0);
          local_b1 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(out,&local_b1,1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0.m_string._M_dataplus._M_p != &local_b0.m_string.field_2) {
            operator_delete(local_b0.m_string._M_dataplus._M_p,
                            local_b0.m_string.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_) !=
              &local_70.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_
                                    ),local_70.field_2._M_allocated_capacity + 1);
          }
        }
        if ((0 < (int)local_74) &&
           ((pTVar2->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pTVar2->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
            super__Vector_impl_data._M_finish)) {
          TestCaseInfo::tagsAsString_abi_cxx11_(&local_70,pTVar2);
          local_b0.m_string._M_dataplus._M_p = (pointer)&local_b0.m_string.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,
                     CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_),
                     local_70._M_string_length +
                     CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_));
          local_b0.m_width = 0x4f;
          local_b0.m_initialIndent = 0xffffffffffffffff;
          local_b0.m_indent = 6;
          TextFlow::operator<<(out,&local_b0);
          local_b1 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(out,&local_b1,1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0.m_string._M_dataplus._M_p != &local_b0.m_string.field_2) {
            operator_delete(local_b0.m_string._M_dataplus._M_p,
                            local_b0.m_string.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_) !=
              &local_70.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_
                                    ),local_70.field_2._M_allocated_capacity + 1);
          }
        }
        if (cVar5 != '\0') {
          (**(code **)(*(long *)_Var4._M_p + 0x10))(_Var4._M_p,0);
        }
        pTVar12 = pTVar12 + 1;
      } while (pTVar12 != local_40);
    }
    if ((char)local_4c == '\0') {
      lVar8 = (long)(local_48->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(local_48->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      local_b0.m_string._M_string_length = 0x2a16d4;
      local_b0.m_string.field_2._M_allocated_capacity = 9;
    }
    else {
      lVar8 = (long)(local_48->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(local_48->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      local_b0.m_string._M_string_length = 0x2a16cb;
      local_b0.m_string.field_2._M_allocated_capacity = 0x12;
    }
    local_b0.m_string._M_dataplus._M_p = (pointer)(lVar8 >> 4);
    operator<<(out,(pluralise *)&local_b0);
    std::__ostream_insert<char,std::char_traits<char>>(out,"\n\n",2);
  }
  std::ostream::flush();
  return;
}

Assistant:

void defaultListTests(std::ostream& out, ColourImpl* streamColour, std::vector<TestCaseHandle> const& tests, bool isFiltered, Verbosity verbosity) {
        // We special case this to provide the equivalent of old
        // `--list-test-names-only`, which could then be used by the
        // `--input-file` option.
        if (verbosity == Verbosity::Quiet) {
            listTestNamesOnly(out, tests);
            return;
        }

        if (isFiltered) {
            out << "Matching test cases:\n";
        } else {
            out << "All available test cases:\n";
        }

        for (auto const& test : tests) {
            auto const& testCaseInfo = test.getTestCaseInfo();
            Colour::Code colour = testCaseInfo.isHidden()
                ? Colour::SecondaryText
                : Colour::None;
            auto colourGuard = streamColour->guardColour( colour ).engage( out );

            out << TextFlow::Column(testCaseInfo.name).indent(2) << '\n';
            if (verbosity >= Verbosity::High) {
                out << TextFlow::Column(Catch::Detail::stringify(testCaseInfo.lineInfo)).indent(4) << '\n';
            }
            if (!testCaseInfo.tags.empty() &&
                verbosity > Verbosity::Quiet) {
                out << TextFlow::Column(testCaseInfo.tagsAsString()).indent(6) << '\n';
            }
        }

        if (isFiltered) {
            out << pluralise(tests.size(), "matching test case"_sr);
        } else {
            out << pluralise(tests.size(), "test case"_sr);
        }
        out << "\n\n" << std::flush;
    }